

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall FBehavior::LoadScriptsDirectory(FBehavior *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  BYTE *pBVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  BYTE *pBVar16;
  ulong *puVar17;
  undefined1 *puVar18;
  ScriptPtr *pSVar19;
  int *piVar20;
  long lVar21;
  size_t __nmemb;
  DWORD *chunk;
  int *piVar22;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  WORD *pWVar26;
  int *piVar27;
  ulong uVar28;
  ACSFormat AVar29;
  FString local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this->NumScripts = 0;
  this->Scripts = (ScriptPtr *)0x0;
  AVar29 = this->Format;
  if (AVar29 - ACS_Enhanced < 2) {
    piVar22 = (int *)this->Chunks;
    if (piVar22 != (int *)0x0) {
      piVar20 = (int *)((long)this->DataSize + (long)this->Data);
      if (piVar22 < piVar20) {
        do {
          if (*piVar22 == 0x52545053) {
            uVar3 = piVar22[1];
            if (*(int *)this->Data == 0x534341) {
              uVar25 = (ulong)(uVar3 >> 3);
              this->NumScripts = uVar3 >> 3;
              puVar17 = (ulong *)operator_new__(uVar25 * 0x38 + 8);
              *puVar17 = uVar25;
              pSVar19 = (ScriptPtr *)(puVar17 + 1);
              if (uVar3 < 8) {
LAB_00502c6e:
                this->Scripts = pSVar19;
              }
              else {
                lVar21 = 0;
                do {
                  *(undefined4 *)((long)puVar17 + lVar21 + 0x18) = 0;
                  puVar1 = (undefined8 *)((long)puVar17 + lVar21 + 0x20);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)puVar17 + lVar21 + 0x30) = 0;
                  *(undefined8 *)((long)puVar17 + lVar21 + 0x34) = 0xffffffff;
                  lVar21 = lVar21 + 0x38;
                } while (uVar25 * 0x38 - lVar21 != 0);
                this->Scripts = pSVar19;
                if (7 < uVar3) {
                  puVar18 = (undefined1 *)((long)puVar17 + 0x11);
                  uVar28 = 0;
                  do {
                    *(int *)(puVar18 + -9) = (int)(short)piVar22[uVar28 * 2 + 2];
                    puVar18[-1] = *(undefined1 *)((long)piVar22 + uVar28 * 8 + 10);
                    *puVar18 = *(undefined1 *)((long)piVar22 + uVar28 * 8 + 0xb);
                    *(int *)(puVar18 + -5) = piVar22[uVar28 * 2 + 3];
                    uVar28 = uVar28 + 1;
                    puVar18 = puVar18 + 0x38;
                  } while (uVar25 != uVar28);
                }
              }
            }
            else {
              uVar25 = (ulong)uVar3 / 0xc;
              this->NumScripts = uVar3 / 0xc;
              puVar17 = (ulong *)operator_new__(uVar25 * 0x38 + 8);
              *puVar17 = uVar25;
              pSVar19 = (ScriptPtr *)(puVar17 + 1);
              if (uVar3 < 0xc) goto LAB_00502c6e;
              lVar21 = 0;
              do {
                *(undefined4 *)((long)puVar17 + lVar21 + 0x18) = 0;
                puVar1 = (undefined8 *)((long)puVar17 + lVar21 + 0x20);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)puVar17 + lVar21 + 0x30) = 0;
                *(undefined8 *)((long)puVar17 + lVar21 + 0x34) = 0xffffffff;
                lVar21 = lVar21 + 0x38;
              } while (uVar25 * 0x38 - lVar21 != 0);
              this->Scripts = pSVar19;
              if (0xb < uVar3) {
                puVar18 = (undefined1 *)((long)puVar17 + 0x11);
                lVar21 = 0;
                do {
                  *(int *)(puVar18 + -9) = (int)*(short *)((long)piVar22 + lVar21 + 8);
                  puVar18[-1] = *(undefined1 *)((long)piVar22 + lVar21 + 10);
                  *puVar18 = *(undefined1 *)((long)piVar22 + lVar21 + 0x10);
                  *(undefined4 *)(puVar18 + -5) = *(undefined4 *)((long)piVar22 + lVar21 + 0xc);
                  puVar18 = puVar18 + 0x38;
                  lVar21 = lVar21 + 0xc;
                } while ((ulong)(uVar3 / 0xc << 2) * 3 != lVar21);
              }
            }
            goto LAB_00502c75;
          }
          piVar22 = (int *)((long)piVar22 + (ulong)(piVar22[1] + 8));
        } while (piVar22 < piVar20);
        goto LAB_00502c9e;
      }
    }
  }
  else if (AVar29 == ACS_Old) {
    pBVar5 = this->Data;
    uVar28 = (ulong)*(uint *)(pBVar5 + 4);
    iVar13 = *(int *)(pBVar5 + uVar28);
    uVar25 = (ulong)iVar13;
    this->NumScripts = iVar13;
    if (uVar25 == 0) {
      return;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar25;
    uVar14 = SUB168(auVar7 * ZEXT816(0x38),0);
    uVar15 = uVar14 + 8;
    if (0xfffffffffffffff7 < uVar14) {
      uVar15 = 0xffffffffffffffff;
    }
    uVar14 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x38),8) == 0) {
      uVar14 = uVar15;
    }
    puVar17 = (ulong *)operator_new__(uVar14);
    *puVar17 = uVar25;
    pSVar19 = (ScriptPtr *)(puVar17 + 1);
    lVar21 = 0;
    do {
      *(undefined4 *)((long)puVar17 + lVar21 + 0x18) = 0;
      puVar1 = (undefined8 *)((long)puVar17 + lVar21 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar17 + lVar21 + 0x30) = 0;
      *(undefined8 *)((long)puVar17 + lVar21 + 0x34) = 0xffffffff;
      lVar21 = lVar21 + 0x38;
    } while (uVar25 * 0x38 - lVar21 != 0);
    this->Scripts = pSVar19;
    if (0 < iVar13) {
      pBVar16 = (BYTE *)((long)puVar17 + 0x11);
      lVar21 = 0;
      do {
        uVar3 = *(uint *)(pBVar5 + lVar21 + uVar28 + 4);
        *(uint *)(pBVar16 + -9) = uVar3 % 1000;
        pBVar16[-1] = (BYTE)(uVar3 / 1000);
        *pBVar16 = pBVar5[lVar21 + uVar28 + 0xc];
        *(undefined4 *)(pBVar16 + -5) = *(undefined4 *)(pBVar5 + lVar21 + uVar28 + 8);
        pBVar16 = pBVar16 + 0x38;
        lVar21 = lVar21 + 0xc;
      } while (uVar25 * 0xc != lVar21);
LAB_00502c75:
      if (0 < (int)uVar25) {
        lVar21 = 0;
        do {
          *(undefined4 *)((long)&pSVar19->VarCount + lVar21) = 0x14;
          lVar21 = lVar21 + 0x38;
        } while ((uVar25 & 0xffffffff) * 0x38 - lVar21 != 0);
        if ((int)uVar25 != 1) {
          qsort(pSVar19,uVar25 & 0xffffffff,0x38,SortScripts);
          if (this->Format != ACS_Old) goto LAB_00502ca7;
          if (this->NumScripts < 2) {
            return;
          }
          lVar21 = 0x38;
          lVar24 = 0;
          do {
            if (*(int *)((long)&this->Scripts[-1].Number + lVar21) ==
                *(int *)((long)&this->Scripts->Number + lVar21)) {
              ScriptPresentation((int)&local_68);
              Printf("\x1cI%s appears more than once.\n",local_68.Chars);
              FString::~FString(&local_68);
              pSVar19 = this->Scripts;
              if ((&pSVar19->Type)[lVar21] == '\0') {
                puVar1 = (undefined8 *)((long)&pSVar19->Number + lVar21);
                puVar2 = (undefined8 *)((long)&pSVar19[-1].Number + lVar21);
                local_68.Chars = (char *)*puVar2;
                uStack_60 = puVar2[1];
                local_58 = *(undefined8 *)((long)pSVar19 + lVar21 + -0x28);
                pvVar6 = *(void **)((long)pSVar19 + lVar21 + -0x20);
                local_38 = *(undefined8 *)((long)pSVar19 + lVar21 + -8);
                puVar2 = (undefined8 *)((long)pSVar19 + lVar21 + -0x18);
                local_48 = *puVar2;
                uStack_40 = puVar2[1];
                *(undefined8 *)((long)pSVar19 + lVar21 + -8) = puVar1[6];
                uVar8 = *puVar1;
                uVar9 = puVar1[1];
                uVar10 = puVar1[2];
                uVar11 = puVar1[3];
                uVar12 = puVar1[5];
                puVar2 = (undefined8 *)((long)pSVar19 + lVar21 + -0x18);
                *puVar2 = puVar1[4];
                puVar2[1] = uVar12;
                puVar2 = (undefined8 *)((long)pSVar19 + lVar21 + -0x28);
                *puVar2 = uVar10;
                puVar2[1] = uVar11;
                puVar2 = (undefined8 *)((long)&pSVar19[-1].Number + lVar21);
                *puVar2 = uVar8;
                puVar2[1] = uVar9;
                *puVar1 = local_68.Chars;
                puVar1[1] = uStack_60;
                puVar1[2] = local_58;
                *(void **)((long)&(pSVar19->LocalArrays).Info + lVar21) = pvVar6;
                puVar1 = (undefined8 *)((long)&(pSVar19->ProfileData).TotalInstr + lVar21);
                *puVar1 = local_48;
                puVar1[1] = uStack_40;
                *(undefined8 *)((long)&(pSVar19->ProfileData).MaxInstrPerRun + lVar21) = local_38;
                if (pvVar6 != (void *)0x0) {
                  operator_delete__(pvVar6);
                }
              }
            }
            lVar24 = lVar24 + 1;
            lVar21 = lVar21 + 0x38;
          } while (lVar24 < (long)this->NumScripts + -1);
          AVar29 = this->Format;
        }
      }
    }
LAB_00502c9e:
    if (AVar29 == ACS_Old) {
      return;
    }
  }
LAB_00502ca7:
  piVar22 = (int *)this->Chunks;
  if (piVar22 == (int *)0x0) {
    return;
  }
  piVar23 = (int *)(this->Data + this->DataSize);
  piVar20 = piVar22;
  if (piVar23 <= piVar22) goto LAB_00502e2c;
  do {
    uVar3 = piVar20[1];
    if (*piVar20 == 0x474c4653) {
      if (3 < uVar3) {
        pWVar26 = (WORD *)((long)piVar20 + 10);
        iVar13 = (uVar3 >> 2) + 1;
        do {
          pSVar19 = FindScript(this,(int)(short)pWVar26[-1]);
          if (pSVar19 != (ScriptPtr *)0x0) {
            pSVar19->Flags = *pWVar26;
          }
          pWVar26 = pWVar26 + 2;
          iVar13 = iVar13 + -1;
        } while (1 < iVar13);
      }
      break;
    }
    piVar20 = (int *)((long)piVar20 + (ulong)(uVar3 + 8));
  } while (piVar20 < piVar23);
  piVar20 = piVar22;
  if (piVar22 < piVar23) {
    do {
      uVar3 = piVar20[1];
      piVar27 = piVar22;
      if (*piVar20 == 0x54435653) {
        if (3 < uVar3) {
          pWVar26 = (WORD *)((long)piVar20 + 10);
          iVar13 = (uVar3 >> 2) + 1;
          do {
            pSVar19 = FindScript(this,(int)(short)pWVar26[-1]);
            if (pSVar19 != (ScriptPtr *)0x0) {
              pSVar19->VarCount = *pWVar26;
            }
            pWVar26 = pWVar26 + 2;
            iVar13 = iVar13 + -1;
          } while (1 < iVar13);
        }
        break;
      }
      piVar20 = (int *)((long)piVar20 + (ulong)(uVar3 + 8));
    } while (piVar20 < piVar23);
    do {
      if (piVar23 <= piVar27) break;
      if (*piVar27 == 0x59524153) goto LAB_00502dc7;
      piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
    } while( true );
  }
  goto LAB_00502e23;
LAB_00502dc7:
  while( true ) {
    iVar13 = piVar27[1];
    if ((5 < iVar13) &&
       (pSVar19 = FindScript(this,(int)(short)piVar27[2]), pSVar19 != (ScriptPtr *)0x0)) {
      iVar13 = ParseLocalArrayChunk(piVar27,&pSVar19->LocalArrays,(uint)pSVar19->VarCount);
      pSVar19->VarCount = (WORD)iVar13;
      iVar13 = piVar27[1];
    }
    piVar22 = (int *)((ulong)(iVar13 + 8) + (long)piVar27);
    if (this->Data + this->DataSize <= piVar22) break;
    iVar13 = *piVar27;
    while (piVar27 = piVar22, *piVar22 != iVar13) {
      piVar22 = (int *)((long)piVar22 + (ulong)(piVar22[1] + 8));
      if (this->Data + this->DataSize <= piVar22) goto LAB_00502e1c;
    }
  }
LAB_00502e1c:
  piVar22 = (int *)this->Chunks;
LAB_00502e23:
  if (piVar22 == (int *)0x0) {
    return;
  }
LAB_00502e2c:
  while( true ) {
    if (this->Data + this->DataSize <= piVar22) {
      return;
    }
    if (*piVar22 == 0x4d414e53) break;
    piVar22 = (int *)((long)piVar22 + (ulong)(piVar22[1] + 8));
  }
  if (piVar22[2] != 0) {
    uVar28 = 0;
    do {
      lVar21 = uVar28 + 3;
      uVar28 = uVar28 + 1;
      strbin((char *)((long)piVar22 + (long)piVar22[lVar21] + 8));
    } while (uVar28 < (uint)piVar22[2]);
  }
  iVar13 = this->NumScripts;
  __nmemb = (size_t)iVar13;
  pSVar19 = this->Scripts;
  if (0 < (long)__nmemb) {
    lVar24 = 0;
    lVar21 = 0;
    do {
      iVar4 = *(int *)((long)&pSVar19->Number + lVar24);
      if (iVar4 < 0) {
        iVar13 = FName::NameManager::FindName
                           (&FName::NameData,
                            (char *)((long)piVar22 + (ulong)(uint)piVar22[2 - iVar4] + 8),false);
        pSVar19 = this->Scripts;
        *(int *)((long)&pSVar19->Number + lVar24) = -iVar13;
        iVar13 = this->NumScripts;
      }
      lVar21 = lVar21 + 1;
      __nmemb = (size_t)iVar13;
      lVar24 = lVar24 + 0x38;
    } while (lVar21 < (long)__nmemb);
  }
  qsort(pSVar19,__nmemb,0x38,SortScripts);
  return;
}

Assistant:

void FBehavior::LoadScriptsDirectory ()
{
	union
	{
		BYTE *b;
		DWORD *dw;
		WORD *w;
		SWORD *sw;
		ScriptPtr2 *po;		// Old
		ScriptPtr1 *pi;		// Intermediate
		ScriptPtr3 *pe;		// LittleEnhanced
	} scripts;
	int i, max;

	NumScripts = 0;
	Scripts = NULL;

	// Load the main script directory
	switch (Format)
	{
	case ACS_Old:
		scripts.dw = (DWORD *)(Data + LittleLong(((DWORD *)Data)[1]));
		NumScripts = LittleLong(scripts.dw[0]);
		if (NumScripts != 0)
		{
			scripts.dw++;

			Scripts = new ScriptPtr[NumScripts];

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr2 *ptr1 = &scripts.po[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleLong(ptr1->Number) % 1000;
				ptr2->Type = LittleLong(ptr1->Number) / 1000;
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	case ACS_Enhanced:
	case ACS_LittleEnhanced:
		scripts.b = FindChunk (MAKE_ID('S','P','T','R'));
		if (scripts.b == NULL)
		{
			// There are no scripts!
		}
		else if (*(DWORD *)Data != MAKE_ID('A','C','S',0))
		{
			NumScripts = LittleLong(scripts.dw[1]) / 12;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr1 *ptr1 = &scripts.pi[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = BYTE(LittleShort(ptr1->Type));
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		else
		{
			NumScripts = LittleLong(scripts.dw[1]) / 8;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr3 *ptr1 = &scripts.pe[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = ptr1->Type;
				ptr2->ArgCount = ptr1->ArgCount;
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	default:
		break;
	}

// [EP] Clang 3.5.0 optimizer miscompiles this function and causes random
// crashes in the program. This is fixed in 3.5.1 onwards.
#if defined(__clang__) && __clang_major__ == 3 && __clang_minor__ == 5 && __clang_patchlevel__ == 0
	asm("" : "+g" (NumScripts));
#endif
	for (i = 0; i < NumScripts; ++i)
	{
		Scripts[i].Flags = 0;
		Scripts[i].VarCount = LOCAL_SIZE;
	}

	// Sort scripts, so we can use a binary search to find them
	if (NumScripts > 1)
	{
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
		// Check for duplicates because ACC originally did not enforce
		// script number uniqueness across different script types. We
		// only need to do this for old format lumps, because the ACCs
		// that produce new format lumps won't let you do this.
		if (Format == ACS_Old)
		{
			for (i = 0; i < NumScripts - 1; ++i)
			{
				if (Scripts[i].Number == Scripts[i+1].Number)
				{
					Printf(TEXTCOLOR_ORANGE "%s appears more than once.\n",
						ScriptPresentation(Scripts[i].Number).GetChars());
					// Make the closed version the first one.
					if (Scripts[i+1].Type == SCRIPT_Closed)
					{
						swapvalues(Scripts[i], Scripts[i+1]);
					}
				}
			}
		}
	}

	if (Format == ACS_Old)
		return;

	// Load script flags
	scripts.b = FindChunk (MAKE_ID('S','F','L','G'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->Flags = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script var counts. (Only recorded for scripts that use more than LOCAL_SIZE variables.)
	scripts.b = FindChunk (MAKE_ID('S','V','C','T'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->VarCount = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script array sizes. (One chunk per script that uses arrays.)
	for (scripts.b = FindChunk(MAKE_ID('S','A','R','Y')); scripts.dw != NULL; scripts.b = NextChunk(scripts.b))
	{
		int size = LittleLong(scripts.dw[1]);
		if (size >= 6)
		{
			int script_num = LittleShort(scripts.sw[4]);
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript(script_num));
			if (ptr != NULL)
			{
				ptr->VarCount = ParseLocalArrayChunk(scripts.b, &ptr->LocalArrays, ptr->VarCount);
			}
		}
	}

	// Load script names (if any)
	scripts.b = FindChunk(MAKE_ID('S','N','A','M'));
	if (scripts.dw != NULL)
	{
		UnescapeStringTable(scripts.b + 8, NULL, false);
		for (i = 0; i < NumScripts; ++i)
		{
			// ACC stores script names as an index into the SNAM chunk, with the first index as
			// -1 and counting down from there. We convert this from an index into SNAM into
			// a negative index into the global name table.
			if (Scripts[i].Number < 0)
			{
				const char *str = (const char *)(scripts.b + 8 + scripts.dw[3 + (-Scripts[i].Number - 1)]);
				FName name(str);
				Scripts[i].Number = -name;
			}
		}
		// We need to resort scripts, because the new numbers for named scripts likely
		// do not match the order they were originally in.
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
	}
}